

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

string * sentencepiece::string_util::UnicodeTextToUTF8_abi_cxx11_(UnicodeText *utext)

{
  bool bVar1;
  reference puVar2;
  undefined8 in_RSI;
  string *in_RDI;
  size_t mblen;
  char32 c;
  const_iterator __end2;
  const_iterator __begin2;
  UnicodeText *__range2;
  char buf [8];
  string *result;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff88;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_stack_ffffffffffffff90;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_30;
  undefined8 local_28;
  undefined1 local_19;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_18;
  undefined8 local_10;
  
  local_19 = 0;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  local_28 = local_10;
  local_30._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         (in_stack_ffffffffffffff88);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffff88);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffff90,
                            (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                             *)in_stack_ffffffffffffff88), bVar1) {
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&local_30);
    in_stack_ffffffffffffff90 = &local_18;
    EncodeUTF8(*puVar2,(char *)in_stack_ffffffffffffff90);
    std::__cxx11::string::append((char *)in_RDI,(ulong)in_stack_ffffffffffffff90);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&local_30);
  }
  return in_RDI;
}

Assistant:

std::string UnicodeTextToUTF8(const UnicodeText &utext) {
  char buf[8];
  std::string result;
  for (const char32 c : utext) {
    const size_t mblen = EncodeUTF8(c, buf);
    result.append(buf, mblen);
  }
  return result;
}